

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

uint stb_hash2(char *str,uint *hash2_ptr)

{
  undefined4 local_20;
  undefined4 local_1c;
  uint hash2;
  uint hash1;
  uint *hash2_ptr_local;
  char *str_local;
  
  local_1c = 0x3141592c;
  local_20 = 0x77f044ed;
  for (hash2_ptr_local = (uint *)str; (char)*hash2_ptr_local != '\0';
      hash2_ptr_local = (uint *)((long)hash2_ptr_local + 1)) {
    local_1c = local_1c * 0x80 + (local_1c >> 0x19) + (int)(char)*hash2_ptr_local;
    local_20 = local_20 * 0x800 + (local_20 >> 0x15) + (int)(char)*hash2_ptr_local;
  }
  *hash2_ptr = local_20 + (local_1c >> 0x10);
  return local_1c + (local_20 >> 0x10);
}

Assistant:

unsigned int stb_hash2(char *str, unsigned int *hash2_ptr)
{
   unsigned int hash1 = 0x3141592c;
   unsigned int hash2 = 0x77f044ed;
   while (*str) {
      hash1 = (hash1 << 7) + (hash1 >> 25) + *str;
      hash2 = (hash2 << 11) + (hash2 >> 21) + *str;
      ++str;
   }
   *hash2_ptr = hash2 + (hash1 >> 16);
   return       hash1 + (hash2 >> 16);
}